

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

void duckdb::ListUniqueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  idx_t count;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  Vector *this_00;
  DataChunk *this_01;
  undefined1 auVar3 [8];
  element_type *peVar4;
  bool bVar5;
  reference vec;
  BoundFunctionExpression *pBVar6;
  pointer pFVar7;
  pointer pEVar8;
  BoundAggregateExpression *pBVar9;
  idx_t iVar10;
  Vector *pVVar11;
  ulong uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  reference other;
  idx_t count_00;
  idx_t idx_in_entry;
  ulong uVar14;
  idx_t child_idx;
  ulong uVar15;
  long *plVar16;
  ArenaAllocator *this_02;
  data_ptr_t pdVar17;
  SelectionVector sel_vector;
  AggregateInputData aggr_input_data;
  Vector slice;
  UnifiedVectorFormat lists_data;
  Vector state_vector_update;
  UnifiedVectorFormat child_data;
  StateVector state_vector;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2b0;
  Vector *local_2a8;
  void *local_2a0;
  Vector *local_298;
  DataChunk *local_290;
  buffer_ptr<ValidityBuffer> *local_288;
  data_ptr_t local_280;
  idx_t local_278;
  data_ptr_t local_270;
  AggregateFunction *local_268;
  SelectionVector local_260;
  idx_t local_248;
  AggregateInputData local_240;
  undefined1 local_228 [8];
  element_type *apeStack_220 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  LogicalType local_1b8;
  UnifiedVectorFormat local_1a0;
  Vector local_158;
  UnifiedVectorFormat local_f0;
  StateVector local_a8;
  
  count = args->count;
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::SetVectorType(result,FLAT_VECTOR);
  FlatVector::VerifyFlatVector(result);
  if ((vec->type).id_ == SQLNULL) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  local_2a8 = result;
  pBVar6 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar7 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar6->bind_info);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(pFVar7 + 4));
  pBVar9 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar8->super_BaseExpression);
  local_a8.count = (idx_t)state[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_a8);
  this_02 = (ArenaAllocator *)(local_a8.count + 8);
  ArenaAllocator::Reset(this_02);
  local_240.bind_data.ptr =
       (pBVar9->bind_info).
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  local_240.combine_type = PRESERVE_INPUT;
  local_240.allocator = this_02;
  iVar10 = ListVector::GetListSize(vec);
  pVVar11 = ListVector::GetEntry(vec);
  Vector::Flatten(pVVar11,iVar10);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_f0);
  local_298 = pVVar11;
  Vector::ToUnifiedFormat(pVVar11,iVar10,&local_f0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_1a0);
  pVVar11 = local_2a8;
  Vector::ToUnifiedFormat(vec,count,&local_1a0);
  local_280 = local_1a0.data;
  local_268 = &pBVar9->function;
  iVar10 = (*(pBVar9->function).state_size)(local_268);
  local_2a0 = operator_new__(iVar10 * count);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(pFVar7 + 4));
  (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_2b0,pEVar8);
  StateVector::StateVector
            (&local_a8,count,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_2b0);
  if (local_2b0._M_head_impl != (Expression *)0x0) {
    (*((local_2b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_2b0._M_head_impl = (Expression *)0x0;
  local_270 = local_a8.state_vector.data;
  LogicalType::LogicalType(&local_1b8,POINTER);
  Vector::Vector(&local_158,&local_1b8,0x800);
  LogicalType::~LogicalType(&local_1b8);
  SelectionVector::SelectionVector(&local_260,0x800);
  local_290 = args;
  if (count == 0) {
    count_00 = 0;
  }
  else {
    local_288 = &(pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    count_00 = 0;
    uVar14 = 0;
    local_278 = iVar10;
    do {
      pdVar17 = (data_ptr_t)(uVar14 * local_278 + (long)local_2a0);
      *(data_ptr_t *)(local_270 + uVar14 * 8) = pdVar17;
      (*(pBVar9->function).initialize)(local_268,pdVar17);
      pVVar11 = local_2a8;
      uVar15 = uVar14;
      if ((local_1a0.sel)->sel_vector != (sel_t *)0x0) {
        uVar15 = (ulong)(local_1a0.sel)->sel_vector[uVar14];
      }
      if ((local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar15 >> 6]
           >> (uVar15 & 0x3f) & 1) != 0)) {
        plVar16 = (long *)(local_280 + uVar15 * 0x10);
        if (plVar16[1] != 0) {
          uVar15 = 0;
          do {
            if (count_00 == 0x800) {
              Vector::Vector((Vector *)local_228,local_298,&local_260,0x800);
              (*(pBVar9->function).update)((Vector *)local_228,&local_240,1,&local_158,0x800);
              if (local_1c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8._M_pi);
              }
              if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
              }
              if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)apeStack_220);
              count_00 = 0;
            }
            uVar12 = *plVar16 + uVar15;
            if ((local_f0.sel)->sel_vector != (sel_t *)0x0) {
              uVar12 = (ulong)(local_f0.sel)->sel_vector[uVar12];
            }
            local_260.sel_vector[count_00] = (sel_t)uVar12;
            *(data_ptr_t *)(local_158.data + count_00 * 8) = pdVar17;
            count_00 = count_00 + 1;
            uVar15 = uVar15 + 1;
          } while (uVar15 < (ulong)plVar16[1]);
        }
      }
      else {
        if ((local_2a8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_248 = (local_2a8->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_228,&local_248);
          peVar4 = apeStack_220[0];
          auVar3 = local_228;
          local_228 = (undefined1  [8])0x0;
          apeStack_220[0] = (element_type *)0x0;
          this = (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar3;
          (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (apeStack_220[0] != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_220[0]);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_288);
          (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar2 = (byte)uVar14 & 0x3f;
        puVar1 = (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar14 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != count);
  }
  this_01 = local_290;
  if (count_00 != 0) {
    Vector::Vector((Vector *)local_228,local_298,&local_260,count_00);
    (*(pBVar9->function).update)((Vector *)local_228,&local_240,1,&local_158,count_00);
    if (local_1c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8._M_pi);
    }
    if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
    }
    if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)apeStack_220);
  }
  other = vector<duckdb::LogicalType,_true>::operator[]
                    (&(pBVar9->function).super_BaseScalarFunction.super_SimpleFunction.arguments,0);
  LogicalType::LogicalType((LogicalType *)local_228,other);
  this_00 = local_2a8;
  pVVar11 = &local_a8.state_vector;
  switch(local_228[1]) {
  case BOOL:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,bool,std::unordered_map<bool,unsigned_long,std::hash<bool>,std::equal_to<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  case UINT8:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_char,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  case INT8:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,signed_char,std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  case UINT16:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_short,std::unordered_map<unsigned_short,unsigned_long,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  case INT16:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,short,std::unordered_map<short,unsigned_long,std::hash<short>,std::equal_to<short>,std::allocator<std::pair<short_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  case UINT32:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_int,std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  case INT32:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,int,std::unordered_map<int,unsigned_long,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  case UINT64:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_long,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  case INT64:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,long,std::unordered_map<long,unsigned_long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  case FLOAT:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,float,std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  case DOUBLE:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,double,std::unordered_map<double,unsigned_long,std::hash<double>,std::equal_to<double>,std::allocator<std::pair<double_const,unsigned_long>>>>
              (local_2a8,pVVar11,count);
    break;
  default:
    if (local_228[1] == VARCHAR) {
      UniqueFunctor::
      ListExecuteFunction<duckdb::FinalizeStringValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
                (local_2a8,pVVar11,count);
      break;
    }
  case UINT64|UINT8:
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeGenericValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
              (local_2a8,pVVar11,count);
  }
  LogicalType::~LogicalType((LogicalType *)local_228);
  bVar5 = DataChunk::AllConstant(this_01);
  if (bVar5) {
    Vector::SetVectorType(this_00,CONSTANT_VECTOR);
  }
  if (local_260.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_158.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_158.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_158.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_158.type);
  StateVector::~StateVector(&local_a8);
  operator_delete__(local_2a0);
  if (local_1a0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_f0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListUniqueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 1);
	ListAggregatesFunction<UniqueFunctor>(args, state, result);
}